

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  ulong *puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Impl *pIVar7;
  Impl *pIVar8;
  function<void_(const_char_*)> *pfVar9;
  function<void_()> *pfVar10;
  ResourceTag tag;
  uint uVar11;
  char *pcVar12;
  uint64_t uVar13;
  VkComputePipelineCreateInfo *pVVar14;
  VkStructureType *pVVar15;
  DatabaseInterface *db_iface;
  undefined8 uVar16;
  VkPhysicalDevice pVVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  DatabaseInterface *pDVar21;
  undefined8 *puVar22;
  mapped_type *pmVar23;
  long *plVar24;
  _func_void__Any_data_ptr_char_ptr_ptr *__tmp_2;
  size_type sVar25;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  size_type sVar26;
  VulkanDevice *device_;
  _Hash_node_base _Var27;
  Impl *pIVar28;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *filter;
  undefined8 uVar29;
  long lVar30;
  _Hash_node_base *p_Var31;
  __node_base _Var32;
  ulong uVar33;
  VkGraphicsPipelineCreateInfo *pVVar34;
  ulong uVar35;
  byte bVar36;
  bool module_only;
  __alloc_node_gen_t __alloc_node_gen_2;
  DisasmMethod method;
  StateReplayer state_replayer_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  VkShaderModule module;
  string output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  replays_raytracing;
  string disasm_match;
  StateReplayer state_replayer;
  Options opts;
  string json_path;
  CLICallbacks cbs;
  unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
  unique_shader_modules;
  FilterReplayer filter_replayer;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  DisasmReplayer replayer;
  CLIParser parser;
  VulkanDevice device;
  char local_1ca2;
  byte local_1ca1;
  string local_1ca0;
  undefined8 local_1c80;
  size_type local_1c78;
  ulong local_1c70;
  DisasmMethod local_1c64;
  StateReplayer local_1c60;
  long local_1c58;
  undefined1 local_1c50 [24];
  __node_base local_1c38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c30;
  VkGraphicsPipelineCreateInfo *local_1c20;
  __node_base *local_1c18;
  __buckets_ptr local_1c10;
  __node_base local_1c08;
  __node_base _Stack_1c00;
  ulong *local_1bf8;
  long local_1bf0;
  ulong local_1be8;
  __node_base_ptr p_Stack_1be0;
  __node_base *local_1bd8;
  size_type local_1bd0;
  __node_base local_1bc8;
  size_type sStack_1bc0;
  string local_1bb8;
  string local_1b98;
  string local_1b78;
  __node_base local_1b58;
  size_type local_1b50;
  _Hash_node_base local_1b48 [2];
  DatabaseInterface *local_1b38;
  __node_base *local_1b30;
  size_type local_1b28;
  __node_base local_1b20;
  size_type sStack_1b18;
  size_type local_1b10;
  VkShaderModule local_1b08;
  __node_base *local_1b00;
  __buckets_ptr local_1af8;
  __node_base local_1af0 [2];
  ulong local_1ae0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1ad8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ab8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1aa8;
  size_t local_1a98;
  __node_base_ptr p_Stack_1a90;
  undefined8 local_1a88;
  undefined1 *local_1a80;
  long local_1a78;
  undefined1 local_1a70;
  undefined7 uStack_1a6f;
  StateReplayer local_1a60;
  Options local_1a58;
  undefined1 local_1a40 [40];
  size_t local_1a18;
  __node_base_ptr local_1a10;
  undefined8 uStack_1a08;
  undefined4 local_1a00;
  undefined8 local_19f8;
  __node_base_ptr p_Stack_19f0;
  _Any_data local_19e8;
  VkPhysicalDevice local_19d8;
  VkDevice pVStack_19d0;
  _Any_data local_19c8;
  _Manager_type local_19b8;
  __node_base_ptr p_Stack_19b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19a8;
  long *local_1998;
  size_type sStack_1990;
  undefined8 local_1988;
  size_t sStack_1980;
  _Hash_node_base local_1978;
  StateCreatorInterface local_1970;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1968;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1930;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_18f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_18c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1888;
  VkApplicationInfo *local_1850;
  VkPhysicalDeviceFeatures2 *pVStack_1848;
  undefined1 local_1840 [40];
  size_t local_1818;
  undefined1 auStack_1810 [16];
  __buckets_ptr local_1800;
  size_type local_17f8;
  __node_base _Stack_17f0;
  undefined4 local_17e8;
  _Prime_rehash_policy local_17e0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_17d0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1798;
  CLICallbacks local_1760;
  undefined1 local_16e8 [480];
  pointer local_1508;
  pointer local_14f0;
  pointer local_14d8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_14b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1480;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1448;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1410;
  CLIParser local_13d8;
  _Any_data local_1348;
  VkPhysicalDevice local_1338;
  VkDevice pVStack_1330;
  undefined1 local_11f8 [528];
  uint32_t local_fe8;
  _func_void_void_ptr *local_fe0;
  undefined6 uStack_fd8;
  undefined2 uStack_fd2;
  undefined4 uStack_fd0;
  bool bStack_fcc;
  bool bStack_fcb;
  undefined1 local_fc8 [2984];
  undefined1 local_420 [976];
  FeatureFilter local_50;
  pointer local_48;
  pointer ppVStack_40;
  pointer local_38;
  
  local_1a40._0_8_ = local_1a40 + 0x10;
  local_1b00 = local_1af0;
  local_1a80 = &local_1a70;
  local_1798._M_buckets = &local_1798._M_single_bucket;
  local_17d0._M_buckets = &local_17d0._M_single_bucket;
  auStack_1810._8_8_ = &local_17e0._M_next_resize;
  local_1840._0_8_ = auStack_1810;
  local_1a40._32_8_ = &p_Stack_19f0;
  local_19c8._M_unused._M_object = local_1a40;
  local_16e8._8_8_ = (VulkanDevice *)0x0;
  local_1798._M_single_bucket = (__node_base_ptr)0x0;
  local_1798._M_rehash_policy._M_next_resize = 0;
  local_1798._M_rehash_policy._M_max_load_factor = 1.0;
  local_1798._M_element_count = 0;
  local_1798._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1798._M_bucket_count = 1;
  local_17d0._M_single_bucket = (__node_base_ptr)0x0;
  local_17d0._M_rehash_policy._M_next_resize = 0;
  local_17d0._M_rehash_policy._M_max_load_factor = 1.0;
  local_17d0._M_element_count = 0;
  local_17d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_17d0._M_bucket_count = 1;
  local_17e0._M_next_resize = 0;
  local_17e0._M_max_load_factor = 0.0;
  local_17e0._4_4_ = 0;
  local_17e8 = 0x3f800000;
  _Stack_17f0._M_nxt = (_Hash_node_base *)0x0;
  local_17f8 = 0;
  local_1800 = (__buckets_ptr)0x1;
  auStack_1810._0_8_ = (__node_base_ptr)0x0;
  local_1818 = 0;
  local_1840._32_4_ = 1.0;
  local_1840._24_8_ = (_Hash_node_base *)0x0;
  local_1840._16_8_ = (_Hash_node_base *)0x0;
  local_1840._8_8_ = (__buckets_ptr)0x1;
  p_Stack_19b0 = (__node_base_ptr)
                 std::
                 _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:983:24)>
                 ::_M_invoke;
  local_19b8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:983:24)>
               ::_M_manager;
  local_19c8._8_8_ = 0;
  pVStack_19d0 = (VkDevice)0x0;
  local_19d8 = (VkPhysicalDevice)0x0;
  local_19e8._8_8_ = 0;
  local_19e8._M_unused._M_object = (undefined **)0x0;
  p_Stack_19f0 = (__node_base_ptr)0x0;
  local_19f8 = 0;
  local_1a00 = 0x3f800000;
  uStack_1a08 = 0;
  local_1a10 = (__node_base_ptr)0x0;
  local_1a18 = 1;
  local_1a40[0x10] = 0;
  local_1a40._8_8_ = 0;
  local_1a58.features = (VkPhysicalDeviceFeatures2 *)0x0;
  local_1a58.application_info = (VkApplicationInfo *)0x0;
  local_1a58.enable_validation = false;
  local_1a58.want_amd_shader_info = false;
  local_1a58.null_device = false;
  local_1a58.want_pipeline_stats = false;
  local_1a58.device_index = -1;
  local_1a70 = 0;
  local_1a78 = 0;
  local_1af0[0]._M_nxt._0_1_ = 0;
  local_1af8 = (__buckets_ptr)0x0;
  local_1c64 = Asm;
  local_1ca2 = '\0';
  local_1348._M_unused._M_object = (void *)0x0;
  local_1348._8_8_ = 0;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:984:20)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:984:20)>
               ::_M_manager;
  local_16e8._0_8_ = local_19c8._M_unused._M_object;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--help",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:985:28)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:985:28)>
               ::_M_manager;
  local_1348._M_unused._M_object = &local_1a58;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--device-index",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:986:33)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:986:33)>
               ::_M_manager;
  local_1348._M_unused._M_object = &local_1a58;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--enable-validation",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = &local_1b00;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:987:22)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:987:22)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--output",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = &local_1c64;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:988:22)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:988:22)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--target",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = &local_1ca2;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:991:27)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:991:27)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--module-only",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = &local_1798;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:992:31)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:992:31)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--filter-graphics",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = &local_17d0;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:995:30)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:995:30)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--filter-compute",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._0_8_ = (undefined8)(auStack_1810 + 8);
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:998:33)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:998:33)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--filter-raytracing",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = local_1840;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1001:29)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1001:29)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--filter-module",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  local_1348._8_8_ = 0;
  local_1348._M_unused._M_object = &local_1a80;
  pVStack_1330 = (VkDevice)
                 std::
                 _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1004:28)>
                 ::_M_invoke;
  local_1338 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1004:28)>
               ::_M_manager;
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)(local_1a40 + 0x20),"--disasm-match",
             (function<void_(Fossilize::CLIParser_&)> *)&local_1348);
  if (local_1338 != (VkPhysicalDevice)0x0) {
    (*(code *)local_1338)(&local_1348,&local_1348,3);
  }
  pVVar17 = local_19d8;
  local_1348._M_unused._M_object = local_19e8._M_unused._M_object;
  local_1348._8_8_ = local_19e8._8_8_;
  local_19e8._M_unused._M_object = (void *)0x0;
  local_19e8._8_8_ = 0;
  local_1338 = local_19d8;
  local_19d8 = (VkPhysicalDevice)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1007:22)>
               ::_M_manager;
  pVStack_1330 = pVStack_19d0;
  pVStack_19d0 = (VkDevice)
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_disasm.cpp:1007:22)>
                 ::_M_invoke;
  if (pVVar17 != (VkPhysicalDevice)0x0) {
    (*(code *)pVVar17)(&local_1348,&local_1348,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_1760,local_1a40 + 0x20,local_1a40 + 0x20);
  local_1760.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1760.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_1760.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1760.error_handler._M_invoker = (_Invoker_type)pVStack_19d0;
  if (local_19d8 != (VkPhysicalDevice)0x0) {
    local_1760.error_handler.super__Function_base._M_functor._M_unused._M_object =
         local_19e8._M_unused._M_object;
    local_1760.error_handler.super__Function_base._M_functor._8_8_ = local_19e8._8_8_;
    local_1760.error_handler.super__Function_base._M_manager = (_Manager_type)local_19d8;
    local_19d8 = (VkPhysicalDevice)0x0;
    pVStack_19d0 = (VkDevice)0x0;
  }
  local_1760.default_handler.super__Function_base._M_functor._M_unused._M_object =
       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)0x0;
  local_1760.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_1760.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1760.default_handler._M_invoker = (_Invoker_type)p_Stack_19b0;
  if (local_19b8 != (_Manager_type)0x0) {
    local_1760.default_handler.super__Function_base._M_functor._M_unused._M_object =
         local_19c8._M_unused._M_object;
    local_1760.default_handler.super__Function_base._M_functor._8_8_ = local_19c8._8_8_;
    local_1760.default_handler.super__Function_base._M_manager = local_19b8;
    local_19b8 = (_Manager_type)0x0;
    p_Stack_19b0 = (__node_base_ptr)0x0;
  }
  Fossilize::CLIParser::CLIParser(&local_13d8,&local_1760,argc + -1,argv + 1);
  if (local_1760.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1760.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_1760.default_handler,(_Any_data *)&local_1760.default_handler,
               __destroy_functor);
  }
  if (local_1760.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1760.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_1760.error_handler,(_Any_data *)&local_1760.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_1760);
  bVar18 = Fossilize::CLIParser::parse(&local_13d8);
  iVar20 = 1;
  if ((!bVar18) || (iVar20 = 0, local_13d8.ended_state != false)) goto LAB_00136e4d;
  if (local_1a40._8_8_ == 0) {
    main_cold_18();
    iVar20 = 1;
    goto LAB_00136e4d;
  }
  iVar20 = 1;
  pDVar21 = Fossilize::create_database((char *)local_1a40._0_8_,ReadOnly);
  iVar19 = (*pDVar21->_vptr_DatabaseInterface[2])(pDVar21);
  if ((char)iVar19 == '\0') {
    main_cold_1();
  }
  else {
    local_1970._vptr_StateCreatorInterface = (_func_int **)&PTR__FilterReplayer_004c1430;
    local_1968._M_buckets = &local_1968._M_single_bucket;
    local_1968._M_bucket_count = 1;
    local_1968._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1968._M_element_count = 0;
    local_1968._M_rehash_policy._M_max_load_factor = 1.0;
    local_1968._M_rehash_policy._M_next_resize = 0;
    local_1968._M_single_bucket = (__node_base_ptr)0x0;
    local_1930._M_buckets = &local_1930._M_single_bucket;
    local_1930._M_bucket_count = 1;
    local_1930._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1930._M_element_count = 0;
    local_1930._M_rehash_policy._M_max_load_factor = 1.0;
    local_1930._M_rehash_policy._M_next_resize = 0;
    local_1930._M_single_bucket = (__node_base_ptr)0x0;
    local_18f8._M_buckets = &local_18f8._M_single_bucket;
    local_18f8._M_bucket_count = 1;
    local_18f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_18f8._M_element_count = 0;
    local_18f8._M_rehash_policy._M_max_load_factor = 1.0;
    local_18f8._M_rehash_policy._M_next_resize = 0;
    local_18f8._M_single_bucket = (__node_base_ptr)0x0;
    local_18c0._M_buckets = &local_18c0._M_single_bucket;
    local_18c0._M_bucket_count = 1;
    local_18c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_18c0._M_element_count = 0;
    local_18c0._M_rehash_policy._M_max_load_factor = 1.0;
    local_18c0._M_rehash_policy._M_next_resize = 0;
    local_18c0._M_single_bucket = (__node_base_ptr)0x0;
    local_1888._M_buckets = &local_1888._M_single_bucket;
    local_1888._M_bucket_count = 1;
    local_1888._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1888._M_element_count = 0;
    local_1888._M_rehash_policy._M_max_load_factor = 1.0;
    local_1850 = (VkApplicationInfo *)0x0;
    pVStack_1848 = (VkPhysicalDeviceFeatures2 *)0x0;
    local_1888._M_rehash_policy._M_next_resize = 0;
    local_1888._M_single_bucket = (__node_base_ptr)0x0;
    uVar29 = 0;
    local_1ad8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1ad8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1ad8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1348._M_unused._M_object = &PTR__VulkanDevice_004c19f0;
    local_fe8 = 0;
    local_1b38 = pDVar21;
    memset((void *)((long)&local_1348 + 8),0,0x144);
    memset(local_11f8,0,0x20c);
    local_fe0 = (_func_void_void_ptr *)0x0;
    uStack_fd8 = 0;
    uStack_fd2 = 0;
    uStack_fd0._0_1_ = false;
    uStack_fd0._1_1_ = false;
    uStack_fd0._2_1_ = false;
    uStack_fd0._3_1_ = false;
    bStack_fcc = false;
    bStack_fcb = false;
    memset(local_fc8,0,0xba4);
    memset(local_420,0,0x3cc);
    Fossilize::FeatureFilter::FeatureFilter(&local_50);
    local_38 = (pointer)0x0;
    local_48 = (pointer)0x0;
    ppVStack_40 = (pointer)0x0;
    if (local_1c64 == ISA) {
      Fossilize::StateReplayer::StateReplayer((StateReplayer *)local_16e8);
      replay_all_hashes(RESOURCE_APPLICATION_INFO,local_1b38,(StateReplayer *)local_16e8,&local_1970
                        ,&local_1ad8,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)0x0);
      uVar29 = local_1a58._0_8_;
      local_1a58.want_amd_shader_info = true;
      uVar16 = local_1a58._0_8_;
      local_1a58.device_index = SUB84(uVar29,4);
      local_1a58._0_3_ = SUB83(uVar16,0);
      local_1a58.want_pipeline_stats = true;
      local_1a58.application_info = local_1850;
      local_1a58.features = pVStack_1848;
      if (local_1ca2 == '\x01') {
        main_cold_4();
LAB_00136d8a:
        fflush(_stderr);
        uVar29 = 1;
        bVar18 = false;
      }
      else {
        bVar18 = Fossilize::VulkanDevice::init_device((VulkanDevice *)&local_1348,&local_1a58);
        if (!bVar18) {
          main_cold_2();
          goto LAB_00136d8a;
        }
        uVar29 = 0;
        bVar18 = true;
        if ((bStack_fcb == false) && (uStack_fd0._3_1_ == false)) {
          main_cold_3();
          goto LAB_00136d8a;
        }
      }
      Fossilize::StateReplayer::~StateReplayer((StateReplayer *)local_16e8);
      if (bVar18) goto LAB_00136f96;
    }
    else {
LAB_00136f96:
      local_1c70 = CONCAT71(local_1c70._1_7_,
                            (((_Hash_node_base *)local_17d0._M_element_count !=
                              (_Hash_node_base *)0x0 ||
                             (_Hash_node_base *)local_1798._M_element_count !=
                             (_Hash_node_base *)0x0) || _Stack_17f0._M_nxt != (_Hash_node_base *)0x0
                            ) || (_Hash_node_base *)local_1840._24_8_ != (_Hash_node_base *)0x0);
      local_1c80 = uVar29;
      if (((((_Hash_node_base *)local_17d0._M_element_count != (_Hash_node_base *)0x0 ||
            (_Hash_node_base *)local_1798._M_element_count != (_Hash_node_base *)0x0) ||
           _Stack_17f0._M_nxt != (_Hash_node_base *)0x0) ||
           (_Hash_node_base *)local_1840._24_8_ != (_Hash_node_base *)0x0) && (local_1ca2 == '\0'))
      {
        Fossilize::StateReplayer::StateReplayer(&local_1c60);
        lVar30 = 0;
        Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles(&local_1c60,false);
        Fossilize::StateReplayer::set_resolve_shader_module_handles(&local_1c60,false);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_1968,&local_1798);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_1930,&local_17d0);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_18f8,auStack_1810 + 8);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_18c0,local_1840);
        pDVar21 = local_1b38;
        local_1c78 = local_18c0._M_element_count;
        do {
          replay_all_hashes(*(ResourceTag *)((long)main::early_playback_order + lVar30),pDVar21,
                            &local_1c60,&local_1970,&local_1ad8,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)0x0);
          db_iface = local_1b38;
          lVar30 = lVar30 + 4;
        } while (lVar30 != 0xc);
        if (local_1c78 == 0) {
          local_19a8._M_allocated_capacity = (size_type)local_16e8;
          local_16e8._0_8_ = (Impl *)0x0;
          local_16e8._8_8_ = local_1968._M_bucket_count;
          local_16e8._16_8_ = (_Hash_node_base *)0x0;
          local_16e8._24_8_ = local_1968._M_element_count;
          local_16e8._32_8_ =
               CONCAT44(local_1968._M_rehash_policy._4_4_,
                        local_1968._M_rehash_policy._M_max_load_factor);
          local_16e8._40_8_ = local_1968._M_rehash_policy._M_next_resize;
          local_16e8._48_8_ = (__node_base_ptr)0x0;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_19a8._M_allocated_capacity,&local_1968,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_19a8._M_allocated_capacity);
          local_19a8._M_allocated_capacity = 0;
          local_19a8._8_8_ = local_1930._M_bucket_count;
          local_1998 = (long *)0x0;
          sStack_1990 = local_1930._M_element_count;
          local_1988 = CONCAT44(local_1930._M_rehash_policy._4_4_,
                                local_1930._M_rehash_policy._M_max_load_factor);
          sStack_1980 = local_1930._M_rehash_policy._M_next_resize;
          local_1978._M_nxt = (_Hash_node_base *)0x0;
          local_1ab8._M_allocated_capacity = (size_type)&local_19a8;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_19a8._M_local_buf,&local_1930,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_1ab8._M_allocated_capacity);
          local_1ab8._M_allocated_capacity = 0;
          local_1ab8._8_8_ = local_18f8._M_bucket_count;
          local_1aa8._M_allocated_capacity = 0;
          local_1aa8._8_8_ = local_18f8._M_element_count;
          local_1a98 = CONCAT44(local_18f8._M_rehash_policy._4_4_,
                                local_18f8._M_rehash_policy._M_max_load_factor);
          p_Stack_1a90 = (__node_base_ptr)local_18f8._M_rehash_policy._M_next_resize;
          local_1a88._0_1_ = false;
          local_1a88._1_1_ = false;
          local_1a88._2_6_ = 0;
          local_1ca0._M_dataplus._M_p = (pointer)&local_1ab8;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_1ab8._M_local_buf,&local_18f8,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_1ca0);
          pDVar21 = local_1b38;
          if ((_Hash_node_base *)local_16e8._16_8_ != (_Hash_node_base *)0x0) {
            p_Var31 = (_Hash_node_base *)local_16e8._16_8_;
            do {
              replay_hash(RESOURCE_GRAPHICS_PIPELINE,(Hash)p_Var31[1]._M_nxt,pDVar21,&local_1c60,
                          &local_1970,&local_1ad8);
              p_Var31 = p_Var31->_M_nxt;
            } while (p_Var31 != (_Hash_node_base *)0x0);
          }
          if (local_1998 != (long *)0x0) {
            plVar24 = local_1998;
            do {
              replay_hash(RESOURCE_COMPUTE_PIPELINE,plVar24[1],pDVar21,&local_1c60,&local_1970,
                          &local_1ad8);
              plVar24 = (long *)*plVar24;
            } while (plVar24 != (long *)0x0);
          }
          if ((long *)local_1aa8._M_allocated_capacity != (long *)0x0) {
            uVar29 = local_1aa8._M_allocated_capacity;
            do {
              replay_hash(RESOURCE_RAYTRACING_PIPELINE,*(Hash *)(uVar29 + 8),pDVar21,&local_1c60,
                          &local_1970,&local_1ad8);
              uVar29 = *(undefined8 *)uVar29;
            } while (uVar29 != 0);
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&local_1ab8);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&local_19a8);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_16e8);
        }
        else {
          lVar30 = 0;
          do {
            replay_all_hashes(*(ResourceTag *)((long)main::playback_order + lVar30),db_iface,
                              &local_1c60,&local_1970,&local_1ad8,
                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)0x0);
            lVar30 = lVar30 + 4;
          } while (lVar30 != 0xc);
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_1798,&local_1968);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&local_17d0,&local_1930);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)(auStack_1810 + 8),&local_18f8);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_1840,&local_18c0);
        if (local_1888._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          _Var32._M_nxt = local_1888._M_before_begin._M_nxt;
          do {
            local_19a8._M_allocated_capacity = (size_type)_Var32._M_nxt[1]._M_nxt;
            local_16e8._0_8_ = (Impl *)local_1840;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_1840,&local_19a8,local_16e8);
            _Var32._M_nxt = (_Var32._M_nxt)->_M_nxt;
          } while (_Var32._M_nxt != (_Hash_node_base *)0x0);
        }
        Fossilize::StateReplayer::~StateReplayer(&local_1c60);
      }
      device_ = (VulkanDevice *)&local_1348;
      Fossilize::StateReplayer::StateReplayer(&local_1a60);
      if (pVStack_1330 == (VkDevice)0x0) {
        device_ = (VulkanDevice *)0x0;
      }
      DisasmReplayer::DisasmReplayer((DisasmReplayer *)local_16e8,device_);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_14b8,&local_1798);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_1480,&local_17d0);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_1448,auStack_1810 + 8);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_1410,local_1840);
      lVar30 = 0;
      do {
        if ((local_1ca2 != '\x01') || (*(int *)((long)main::playback_order + lVar30) == 4)) {
          tag = *(ResourceTag *)((long)main::playback_order + lVar30);
          pcVar12 = main::tag_names[tag];
          fprintf(_stderr,"Fossilize INFO: Replaying tag: %s\n",pcVar12);
          fflush(_stderr);
          if ((byte)local_1c70 == '\0') {
            filter = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)0x0;
          }
          else {
            filter = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)0x0;
            switch(tag) {
            case RESOURCE_SHADER_MODULE:
              filter = &local_1410;
              break;
            case RESOURCE_GRAPHICS_PIPELINE:
              filter = &local_14b8;
              break;
            case RESOURCE_COMPUTE_PIPELINE:
              filter = &local_1480;
              break;
            case RESOURCE_RAYTRACING_PIPELINE:
              filter = &local_1448;
            }
          }
          replay_all_hashes(tag,local_1b38,&local_1a60,(StateCreatorInterface *)local_16e8,
                            &local_1ad8,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)filter);
          fprintf(_stderr,"Fossilize INFO: Replayed tag: %s\n",pcVar12);
          fflush(_stderr);
        }
        lVar30 = lVar30 + 4;
      } while (lVar30 != 0x24);
      local_19a8._M_allocated_capacity = (size_type)&local_1978;
      local_19a8._8_8_ = 1;
      local_1998 = (long *)0x0;
      sStack_1990 = 0;
      local_1988 = CONCAT44(local_1988._4_4_,0x3f800000);
      sStack_1980 = 0;
      local_1978._M_nxt = (_Hash_node_base *)0x0;
      if (local_1ca2 == '\0') {
        local_1ab8._M_allocated_capacity = (size_type)&local_1aa8;
        local_1ab8._8_8_ = 0;
        local_1aa8._M_allocated_capacity = (ulong)(uint7)local_1aa8._M_allocated_capacity._1_7_ << 8
        ;
        iVar20 = 0x22;
        uVar29 = local_1c80;
        if (local_16e8._144_8_ - local_16e8._136_8_ != 0) {
          lVar30 = (long)(local_16e8._144_8_ - local_16e8._136_8_) >> 3;
          sVar25 = lVar30 + (ulong)(lVar30 == 0);
          sVar26 = 0;
          local_1b10 = sVar25;
          do {
            pVVar34 = *(pointer)(local_16e8._136_8_ + sVar26 * 8);
            bVar18 = pVVar34->stageCount == 0;
            bVar36 = !bVar18;
            if (bVar18) {
              iVar20 = 0;
            }
            else {
              uVar35 = 0;
              uVar33 = 0;
              local_1c80 = uVar29;
              local_1c78 = sVar26;
              local_1c20 = pVVar34;
              do {
                local_1b08 = *(VkShaderModule *)((long)&pVVar34->pStages->module + uVar35);
                local_1ca0._M_dataplus._M_p = (pointer)&local_19a8;
                local_1ca1 = bVar36;
                local_1ae0 = uVar33;
                std::
                _Hashtable<VkShaderModule_T*,VkShaderModule_T*,std::allocator<VkShaderModule_T*>,std::__detail::_Identity,std::equal_to<VkShaderModule_T*>,std::hash<VkShaderModule_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<VkShaderModule_T*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<VkShaderModule_T*,false>>>>
                          ((_Hashtable<VkShaderModule_T*,VkShaderModule_T*,std::allocator<VkShaderModule_T*>,std::__detail::_Identity,std::equal_to<VkShaderModule_T*>,std::hash<VkShaderModule_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_1ca0._M_dataplus._M_p,&local_1b08,&local_1ca0);
                pmVar23 = std::__detail::
                          _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)(local_16e8 + 0x130),&local_1b08);
                uVar11 = *pmVar23;
                local_1c70 = uVar35;
                disassemble_spirv_abi_cxx11_
                          (&local_1ca0,(VulkanDevice *)&local_1348,local_14f0[local_1c78],local_1c64
                           ,*(VkShaderStageFlagBits *)((long)&pVVar34->pStages->stage + uVar35),
                           *(pointer)(local_16e8._88_8_ + (ulong)uVar11 * 8),
                           *(char **)((long)&pVVar34->pStages->pName + uVar35));
                std::__cxx11::string::operator=
                          ((string *)local_1ab8._M_local_buf,(string *)&local_1ca0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
                  operator_delete(local_1ca0._M_dataplus._M_p,
                                  local_1ca0.field_2._M_allocated_capacity + 1);
                }
                uVar13 = *(uint64_t *)(local_16e8._280_8_ + (ulong)uVar11 * 8);
                local_1b58._M_nxt = local_1b48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1b58,local_1b00,(long)local_1af8 + (long)local_1b00);
                std::__cxx11::string::append((char *)&local_1b58);
                uint64_string_abi_cxx11_(&local_1b78,uVar13);
                _Var27._M_nxt = (_Hash_node_base *)0xf;
                if (local_1b58._M_nxt != local_1b48) {
                  _Var27._M_nxt = local_1b48[0]._M_nxt;
                }
                p_Var31 = (_Hash_node_base *)
                          ((long)(_Hash_node_base **)local_1b78._M_string_length + local_1b50);
                if (_Var27._M_nxt < p_Var31) {
                  uVar29 = (_Hash_node_base *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
                    uVar29 = local_1b78.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar29 < p_Var31) goto LAB_00137a30;
                  plVar24 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_1b78,0,(char *)0x0,
                                               (ulong)local_1b58._M_nxt);
                }
                else {
LAB_00137a30:
                  plVar24 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_1b58,
                                               (ulong)local_1b78._M_dataplus._M_p);
                }
                p_Var2 = (__node_base *)(plVar24 + 2);
                if ((__node_base *)*plVar24 == p_Var2) {
                  local_1c08._M_nxt = p_Var2->_M_nxt;
                  _Stack_1c00._M_nxt = (_Hash_node_base *)plVar24[3];
                  local_1c18 = &local_1c08;
                }
                else {
                  local_1c08._M_nxt = p_Var2->_M_nxt;
                  local_1c18 = (__node_base *)*plVar24;
                }
                local_1c10 = (__buckets_ptr)plVar24[1];
                *plVar24 = (long)p_Var2;
                plVar24[1] = 0;
                *(undefined1 *)&p_Var2->_M_nxt = 0;
                plVar24 = (long *)std::__cxx11::string::append((char *)&local_1c18);
                p_Var3 = (__node_base *)(plVar24 + 2);
                if ((__node_base *)*plVar24 == p_Var3) {
                  local_1bc8._M_nxt = p_Var3->_M_nxt;
                  sStack_1bc0 = plVar24[3];
                  local_1bd8 = &local_1bc8;
                }
                else {
                  local_1bc8._M_nxt = p_Var3->_M_nxt;
                  local_1bd8 = (__node_base *)*plVar24;
                }
                local_1bd0 = plVar24[1];
                *plVar24 = (long)p_Var3;
                plVar24[1] = 0;
                *(undefined1 *)(plVar24 + 2) = 0;
                plVar24 = (long *)std::__cxx11::string::append((char *)&local_1bd8);
                p_Var4 = (__node_base *)(plVar24 + 2);
                if ((__node_base *)*plVar24 == p_Var4) {
                  local_1b20._M_nxt = p_Var4->_M_nxt;
                  sStack_1b18 = plVar24[3];
                  local_1b30 = &local_1b20;
                }
                else {
                  local_1b20._M_nxt = p_Var4->_M_nxt;
                  local_1b30 = (__node_base *)*plVar24;
                }
                local_1b28 = plVar24[1];
                *plVar24 = (long)p_Var4;
                plVar24[1] = 0;
                *(undefined1 *)(plVar24 + 2) = 0;
                plVar24 = (long *)std::__cxx11::string::append((char *)&local_1b30);
                puVar5 = (ulong *)(plVar24 + 2);
                if ((ulong *)*plVar24 == puVar5) {
                  local_1be8 = *puVar5;
                  p_Stack_1be0 = (__node_base_ptr)plVar24[3];
                  local_1bf8 = &local_1be8;
                }
                else {
                  local_1be8 = *puVar5;
                  local_1bf8 = (ulong *)*plVar24;
                }
                local_1bf0 = plVar24[1];
                *plVar24 = (long)puVar5;
                plVar24[1] = 0;
                *(undefined1 *)(plVar24 + 2) = 0;
                uint64_string_abi_cxx11_
                          (&local_1b98,*(uint64_t *)(local_16e8._208_8_ + local_1c78 * 8));
                uVar33 = 0xf;
                if (local_1bf8 != &local_1be8) {
                  uVar33 = local_1be8;
                }
                uVar35 = (long)(_Hash_node_base **)local_1b98._M_string_length + local_1bf0;
                if (uVar33 < uVar35) {
                  uVar29 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
                    uVar29 = local_1b98.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar29 < uVar35) goto LAB_00137c4a;
                  puVar22 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_1b98,0,(char *)0x0,(ulong)local_1bf8);
                }
                else {
LAB_00137c4a:
                  puVar22 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_1bf8,(ulong)local_1b98._M_dataplus._M_p);
                }
                paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(puVar22 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar22 == paVar6) {
                  local_1c30._M_allocated_capacity = paVar6->_M_allocated_capacity;
                  local_1c30._8_8_ = puVar22[3];
                  local_1c50._16_8_ = &local_1c30;
                }
                else {
                  local_1c30._M_allocated_capacity = paVar6->_M_allocated_capacity;
                  local_1c50._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar22;
                }
                local_1c38._M_nxt = (_Hash_node_base *)puVar22[1];
                *puVar22 = paVar6;
                puVar22[1] = 0;
                paVar6->_M_local_buf[0] = '\0';
                plVar24 = (long *)std::__cxx11::string::append(local_1c50 + 0x10);
                pVVar34 = local_1c20;
                pIVar7 = (Impl *)(plVar24 + 2);
                if ((Impl *)*plVar24 == pIVar7) {
                  local_1c50._0_8_ = (pIVar7->allocator).impl;
                  local_1c50._8_8_ = plVar24[3];
                  local_1c60.impl = (Impl *)local_1c50;
                }
                else {
                  local_1c50._0_8_ = (pIVar7->allocator).impl;
                  local_1c60.impl = (Impl *)*plVar24;
                }
                local_1c58 = plVar24[1];
                *plVar24 = (long)pIVar7;
                plVar24[1] = 0;
                *(undefined1 *)(plVar24 + 2) = 0;
                stage_to_string_abi_cxx11_
                          (&local_1bb8,
                           *(VkShaderStageFlagBits *)
                            ((long)&local_1c20->pStages->stage + local_1c70));
                pIVar28 = (Impl *)0xf;
                if (local_1c60.impl != (Impl *)local_1c50) {
                  pIVar28 = (Impl *)local_1c50._0_8_;
                }
                if (pIVar28 < (Impl *)(local_1bb8._M_string_length + local_1c58)) {
                  uVar29 = (Impl *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
                    uVar29 = local_1bb8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar29 < (Impl *)(local_1bb8._M_string_length + local_1c58))
                  goto LAB_00137d92;
                  puVar22 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_1bb8,0,(char *)0x0,(ulong)local_1c60.impl);
                }
                else {
LAB_00137d92:
                  puVar22 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_1c60,(ulong)local_1bb8._M_dataplus._M_p);
                }
                local_1ca0._M_dataplus._M_p = (pointer)&local_1ca0.field_2;
                paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(puVar22 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar22 == paVar6) {
                  local_1ca0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                  local_1ca0.field_2._8_8_ = puVar22[3];
                }
                else {
                  local_1ca0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                  local_1ca0._M_dataplus._M_p = (pointer)*puVar22;
                }
                local_1ca0._M_string_length = puVar22[1];
                *puVar22 = paVar6;
                puVar22[1] = 0;
                paVar6->_M_local_buf[0] = '\0';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
                  operator_delete(local_1bb8._M_dataplus._M_p,
                                  (ulong)(local_1bb8.field_2._M_allocated_capacity + 1));
                }
                if (local_1c60.impl != (Impl *)local_1c50) {
                  operator_delete(local_1c60.impl,
                                  (ulong)((long)&(((
                                                  vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                  *)local_1c50._0_8_)->
                                                 super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c50._16_8_ != &local_1c30) {
                  operator_delete((void *)local_1c50._16_8_,
                                  (ulong)(local_1c30._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
                  operator_delete(local_1b98._M_dataplus._M_p,
                                  local_1b98.field_2._M_allocated_capacity + 1);
                }
                if (local_1bf8 != &local_1be8) {
                  operator_delete(local_1bf8,local_1be8 + 1);
                }
                if (local_1b30 != &local_1b20) {
                  operator_delete(local_1b30,(ulong)((long)&(local_1b20._M_nxt)->_M_nxt + 1));
                }
                if (local_1bd8 != &local_1bc8) {
                  operator_delete(local_1bd8,(ulong)((long)&(local_1bc8._M_nxt)->_M_nxt + 1));
                }
                if (local_1c18 != &local_1c08) {
                  operator_delete(local_1c18,(ulong)((long)&(local_1c08._M_nxt)->_M_nxt + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
                  operator_delete(local_1b78._M_dataplus._M_p,
                                  (ulong)(local_1b78.field_2._M_allocated_capacity + 1));
                }
                if (local_1b58._M_nxt != local_1b48) {
                  operator_delete(local_1b58._M_nxt,
                                  (ulong)((long)&(local_1b48[0]._M_nxt)->_M_nxt + 1));
                }
                if (local_1a78 == 0) {
                  main_cold_6();
LAB_00137fff:
                  fflush(_stderr);
                }
                else {
                  lVar30 = std::__cxx11::string::find(local_1ab8._M_local_buf,(ulong)local_1a80,0);
                  if (lVar30 != -1) {
                    main_cold_5();
                    goto LAB_00137fff;
                  }
                }
                bVar18 = Fossilize::write_string_to_file
                                   (local_1ca0._M_dataplus._M_p,
                                    (char *)local_1ab8._M_allocated_capacity);
                if (!bVar18) {
                  main_cold_7();
                  local_1c80 = 1;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
                  operator_delete(local_1ca0._M_dataplus._M_p,
                                  local_1ca0.field_2._M_allocated_capacity + 1);
                }
                sVar25 = local_1b10;
                sVar26 = local_1c78;
                uVar29 = local_1c80;
                if (!bVar18) {
                  iVar20 = 1;
                  bVar36 = local_1ca1;
                  goto LAB_00138049;
                }
                uVar33 = local_1ae0 + 1;
                uVar35 = local_1c70 + 0x30;
                bVar36 = uVar33 < pVVar34->stageCount;
              } while ((bool)bVar36);
              iVar20 = 0;
            }
LAB_00138049:
            if ((bVar36 & 1) != 0) goto LAB_001380cf;
            sVar26 = sVar26 + 1;
          } while (sVar26 != sVar25);
          iVar20 = 0x22;
        }
LAB_001380cf:
        if (iVar20 == 0x22) {
          lVar30 = local_16e8._168_8_ - local_16e8._160_8_;
          uVar33 = (ulong)(lVar30 != 0);
          local_1c80 = uVar29;
          if (lVar30 != 0) {
            local_1c20 = (VkGraphicsPipelineCreateInfo *)(lVar30 >> 3);
            local_1c78 = -(ulong)(local_1c20 == (VkGraphicsPipelineCreateInfo *)0x0) -
                         (long)local_1c20;
            pVVar34 = (VkGraphicsPipelineCreateInfo *)0x1;
            do {
              local_1c70 = CONCAT71(local_1c70._1_7_,(char)uVar33);
              pVVar14 = *(pointer)(local_16e8._160_8_ + &pVVar34[-1].field_0x8f * 8);
              local_1b08 = (pVVar14->stage).module;
              local_1ca0._M_dataplus._M_p = (pointer)&local_19a8;
              std::
              _Hashtable<VkShaderModule_T*,VkShaderModule_T*,std::allocator<VkShaderModule_T*>,std::__detail::_Identity,std::equal_to<VkShaderModule_T*>,std::hash<VkShaderModule_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<VkShaderModule_T*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<VkShaderModule_T*,false>>>>
                        ((_Hashtable<VkShaderModule_T*,VkShaderModule_T*,std::allocator<VkShaderModule_T*>,std::__detail::_Identity,std::equal_to<VkShaderModule_T*>,std::hash<VkShaderModule_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_1ca0._M_dataplus._M_p,&local_1b08,&local_1ca0);
              pmVar23 = std::__detail::
                        _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)(local_16e8 + 0x130),&local_1b08);
              uVar11 = *pmVar23;
              disassemble_spirv_abi_cxx11_
                        (&local_1ca0,(VulkanDevice *)&local_1348,
                         local_1508[(long)&pVVar34[-1].field_0x8f],local_1c64,(pVVar14->stage).stage
                         ,*(pointer)(local_16e8._88_8_ + (ulong)uVar11 * 8),(pVVar14->stage).pName);
              std::__cxx11::string::operator=
                        ((string *)local_1ab8._M_local_buf,(string *)&local_1ca0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
                operator_delete(local_1ca0._M_dataplus._M_p,
                                local_1ca0.field_2._M_allocated_capacity + 1);
              }
              uVar13 = *(uint64_t *)(local_16e8._280_8_ + (ulong)uVar11 * 8);
              local_1b58._M_nxt = local_1b48;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b58,local_1b00,(long)local_1af8 + (long)local_1b00);
              std::__cxx11::string::append((char *)&local_1b58);
              uint64_string_abi_cxx11_(&local_1b78,uVar13);
              _Var27._M_nxt = (_Hash_node_base *)0xf;
              if (local_1b58._M_nxt != local_1b48) {
                _Var27._M_nxt = local_1b48[0]._M_nxt;
              }
              p_Var31 = (_Hash_node_base *)
                        ((long)(_Hash_node_base **)local_1b78._M_string_length + local_1b50);
              if (_Var27._M_nxt < p_Var31) {
                uVar29 = (_Hash_node_base *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
                  uVar29 = local_1b78.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar29 < p_Var31) goto LAB_0013829f;
                plVar24 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_1b78,0,(char *)0x0,
                                             (ulong)local_1b58._M_nxt);
              }
              else {
LAB_0013829f:
                plVar24 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_1b58,(ulong)local_1b78._M_dataplus._M_p)
                ;
              }
              p_Var2 = (__node_base *)(plVar24 + 2);
              if ((__node_base *)*plVar24 == p_Var2) {
                local_1c08._M_nxt = p_Var2->_M_nxt;
                _Stack_1c00._M_nxt = (_Hash_node_base *)plVar24[3];
                local_1c18 = &local_1c08;
              }
              else {
                local_1c08._M_nxt = p_Var2->_M_nxt;
                local_1c18 = (__node_base *)*plVar24;
              }
              local_1c10 = (__buckets_ptr)plVar24[1];
              *plVar24 = (long)p_Var2;
              plVar24[1] = 0;
              *(undefined1 *)&p_Var2->_M_nxt = 0;
              plVar24 = (long *)std::__cxx11::string::append((char *)&local_1c18);
              local_1bd8 = &local_1bc8;
              p_Var3 = (__node_base *)(plVar24 + 2);
              if ((__node_base *)*plVar24 == p_Var3) {
                local_1bc8._M_nxt = p_Var3->_M_nxt;
                sStack_1bc0 = plVar24[3];
              }
              else {
                local_1bc8._M_nxt = p_Var3->_M_nxt;
                local_1bd8 = (__node_base *)*plVar24;
              }
              local_1bd0 = plVar24[1];
              *plVar24 = (long)p_Var3;
              plVar24[1] = 0;
              *(undefined1 *)(plVar24 + 2) = 0;
              plVar24 = (long *)std::__cxx11::string::append((char *)&local_1bd8);
              local_1b30 = &local_1b20;
              p_Var4 = (__node_base *)(plVar24 + 2);
              if ((__node_base *)*plVar24 == p_Var4) {
                local_1b20._M_nxt = p_Var4->_M_nxt;
                sStack_1b18 = plVar24[3];
              }
              else {
                local_1b20._M_nxt = p_Var4->_M_nxt;
                local_1b30 = (__node_base *)*plVar24;
              }
              local_1b28 = plVar24[1];
              *plVar24 = (long)p_Var4;
              plVar24[1] = 0;
              *(undefined1 *)(plVar24 + 2) = 0;
              plVar24 = (long *)std::__cxx11::string::append((char *)&local_1b30);
              puVar5 = (ulong *)(plVar24 + 2);
              if ((ulong *)*plVar24 == puVar5) {
                local_1be8 = *puVar5;
                p_Stack_1be0 = (__node_base_ptr)plVar24[3];
                local_1bf8 = &local_1be8;
              }
              else {
                local_1be8 = *puVar5;
                local_1bf8 = (ulong *)*plVar24;
              }
              local_1bf0 = plVar24[1];
              *plVar24 = (long)puVar5;
              plVar24[1] = 0;
              *(undefined1 *)(plVar24 + 2) = 0;
              uint64_string_abi_cxx11_
                        (&local_1b98,*(uint64_t *)(local_16e8._232_8_ + &pVVar34[-1].field_0x8f * 8)
                        );
              uVar33 = 0xf;
              if (local_1bf8 != &local_1be8) {
                uVar33 = local_1be8;
              }
              uVar35 = (long)(_Hash_node_base **)local_1b98._M_string_length + local_1bf0;
              if (uVar33 < uVar35) {
                uVar29 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
                  uVar29 = local_1b98.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar29 < uVar35) goto LAB_001384ac;
                puVar22 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_1b98,0,(char *)0x0,(ulong)local_1bf8);
              }
              else {
LAB_001384ac:
                puVar22 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_1bf8,(ulong)local_1b98._M_dataplus._M_p);
              }
              local_1c50._16_8_ = &local_1c30;
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar22 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar22 == paVar6) {
                local_1c30._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_1c30._8_8_ = puVar22[3];
              }
              else {
                local_1c30._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_1c50._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar22;
              }
              local_1c38._M_nxt = (_Hash_node_base *)puVar22[1];
              *puVar22 = paVar6;
              puVar22[1] = 0;
              paVar6->_M_local_buf[0] = '\0';
              plVar24 = (long *)std::__cxx11::string::append(local_1c50 + 0x10);
              pIVar7 = (Impl *)(plVar24 + 2);
              if ((Impl *)*plVar24 == pIVar7) {
                local_1c50._0_8_ = (pIVar7->allocator).impl;
                local_1c50._8_8_ = plVar24[3];
                local_1c60.impl = (Impl *)local_1c50;
              }
              else {
                local_1c50._0_8_ = (pIVar7->allocator).impl;
                local_1c60.impl = (Impl *)*plVar24;
              }
              local_1c58 = plVar24[1];
              *plVar24 = (long)pIVar7;
              plVar24[1] = 0;
              *(undefined1 *)(plVar24 + 2) = 0;
              stage_to_string_abi_cxx11_(&local_1bb8,(pVVar14->stage).stage);
              pIVar28 = (Impl *)0xf;
              if (local_1c60.impl != (Impl *)local_1c50) {
                pIVar28 = (Impl *)local_1c50._0_8_;
              }
              if (pIVar28 < (Impl *)(local_1bb8._M_string_length + local_1c58)) {
                uVar29 = (Impl *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
                  uVar29 = local_1bb8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar29 < (Impl *)(local_1bb8._M_string_length + local_1c58))
                goto LAB_001385d3;
                puVar22 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_1bb8,0,(char *)0x0,(ulong)local_1c60.impl);
              }
              else {
LAB_001385d3:
                puVar22 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_1c60,(ulong)local_1bb8._M_dataplus._M_p);
              }
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar22 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar22 == paVar6) {
                local_1ca0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_1ca0.field_2._8_8_ = puVar22[3];
                local_1ca0._M_dataplus._M_p = (pointer)&local_1ca0.field_2;
              }
              else {
                local_1ca0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_1ca0._M_dataplus._M_p = (pointer)*puVar22;
              }
              local_1ca0._M_string_length = puVar22[1];
              *puVar22 = paVar6;
              puVar22[1] = 0;
              paVar6->_M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
                operator_delete(local_1bb8._M_dataplus._M_p,
                                (ulong)(local_1bb8.field_2._M_allocated_capacity + 1));
              }
              if (local_1c60.impl != (Impl *)local_1c50) {
                operator_delete(local_1c60.impl,
                                (ulong)((long)&(((vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                  *)local_1c50._0_8_)->
                                               super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c50._16_8_ != &local_1c30) {
                operator_delete((void *)local_1c50._16_8_,
                                (ulong)(local_1c30._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
                operator_delete(local_1b98._M_dataplus._M_p,
                                local_1b98.field_2._M_allocated_capacity + 1);
              }
              if (local_1bf8 != &local_1be8) {
                operator_delete(local_1bf8,local_1be8 + 1);
              }
              if (local_1b30 != &local_1b20) {
                operator_delete(local_1b30,(ulong)((long)&(local_1b20._M_nxt)->_M_nxt + 1));
              }
              if (local_1bd8 != &local_1bc8) {
                operator_delete(local_1bd8,(ulong)((long)&(local_1bc8._M_nxt)->_M_nxt + 1));
              }
              if (local_1c18 != &local_1c08) {
                operator_delete(local_1c18,(ulong)((long)&(local_1c08._M_nxt)->_M_nxt + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
                operator_delete(local_1b78._M_dataplus._M_p,
                                (ulong)(local_1b78.field_2._M_allocated_capacity + 1));
              }
              if (local_1b58._M_nxt != local_1b48) {
                operator_delete(local_1b58._M_nxt,(ulong)((long)&(local_1b48[0]._M_nxt)->_M_nxt + 1)
                               );
              }
              if (local_1a78 == 0) {
                main_cold_9();
LAB_00138853:
                fflush(_stderr);
              }
              else {
                lVar30 = std::__cxx11::string::find(local_1ab8._M_local_buf,(ulong)local_1a80,0);
                if (lVar30 != -1) {
                  main_cold_8();
                  goto LAB_00138853;
                }
              }
              bVar18 = Fossilize::write_string_to_file
                                 (local_1ca0._M_dataplus._M_p,
                                  (char *)local_1ab8._M_allocated_capacity);
              if (!bVar18) {
                main_cold_10();
                local_1c80 = 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
                operator_delete(local_1ca0._M_dataplus._M_p,
                                local_1ca0.field_2._M_allocated_capacity + 1);
              }
              if (!bVar18) {
                uVar33 = local_1c70 & 0xff;
                break;
              }
              uVar33 = (ulong)(pVVar34 < local_1c20);
              pVVar15 = &pVVar34->sType;
              pVVar34 = (VkGraphicsPipelineCreateInfo *)((long)&pVVar34->sType + 1);
            } while ((long)pVVar15 + local_1c78 != 0);
          }
          iVar20 = 1;
          uVar29 = local_1c80;
          if ((uVar33 & 1) == 0) {
            iVar20 = 0x37;
            if (local_16e8._192_8_ - local_16e8._184_8_ != 0) {
              lVar30 = (long)(local_16e8._192_8_ - local_16e8._184_8_) >> 3;
              sVar25 = lVar30 + (ulong)(lVar30 == 0);
              sVar26 = 0;
              local_1b10 = sVar25;
              do {
                pVVar34 = *(VkGraphicsPipelineCreateInfo **)(local_16e8._184_8_ + sVar26 * 8);
                bVar18 = pVVar34->stageCount == 0;
                bVar36 = !bVar18;
                if (bVar18) {
                  iVar20 = 0;
                }
                else {
                  uVar35 = 0;
                  uVar33 = 0;
                  local_1c80 = uVar29;
                  local_1c78 = sVar26;
                  local_1c20 = pVVar34;
                  do {
                    local_1b08 = *(VkShaderModule *)((long)&pVVar34->pStages->module + uVar35);
                    local_1ca0._M_dataplus._M_p = (pointer)&local_19a8;
                    local_1ca1 = bVar36;
                    local_1ae0 = uVar33;
                    std::
                    _Hashtable<VkShaderModule_T*,VkShaderModule_T*,std::allocator<VkShaderModule_T*>,std::__detail::_Identity,std::equal_to<VkShaderModule_T*>,std::hash<VkShaderModule_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<VkShaderModule_T*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<VkShaderModule_T*,false>>>>
                              ((_Hashtable<VkShaderModule_T*,VkShaderModule_T*,std::allocator<VkShaderModule_T*>,std::__detail::_Identity,std::equal_to<VkShaderModule_T*>,std::hash<VkShaderModule_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_1ca0._M_dataplus._M_p,&local_1b08,&local_1ca0);
                    pmVar23 = std::__detail::
                              _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)(local_16e8 + 0x130),&local_1b08);
                    uVar11 = *pmVar23;
                    local_1c70 = uVar35;
                    disassemble_spirv_abi_cxx11_
                              (&local_1ca0,(VulkanDevice *)&local_1348,local_14d8[local_1c78],
                               local_1c64,
                               *(VkShaderStageFlagBits *)((long)&pVVar34->pStages->stage + uVar35),
                               *(pointer)(local_16e8._88_8_ + (ulong)uVar11 * 8),
                               *(char **)((long)&pVVar34->pStages->pName + uVar35));
                    std::__cxx11::string::operator=
                              ((string *)local_1ab8._M_local_buf,(string *)&local_1ca0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
                      operator_delete(local_1ca0._M_dataplus._M_p,
                                      local_1ca0.field_2._M_allocated_capacity + 1);
                    }
                    uVar13 = *(uint64_t *)(local_16e8._280_8_ + (ulong)uVar11 * 8);
                    local_1b58._M_nxt = local_1b48;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1b58,local_1b00,(long)local_1af8 + (long)local_1b00)
                    ;
                    std::__cxx11::string::append((char *)&local_1b58);
                    uint64_string_abi_cxx11_(&local_1b78,uVar13);
                    _Var27._M_nxt = (_Hash_node_base *)0xf;
                    if (local_1b58._M_nxt != local_1b48) {
                      _Var27._M_nxt = local_1b48[0]._M_nxt;
                    }
                    p_Var31 = (_Hash_node_base *)
                              ((long)(_Hash_node_base **)local_1b78._M_string_length + local_1b50);
                    if (_Var27._M_nxt < p_Var31) {
                      uVar29 = (_Hash_node_base *)0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
                        uVar29 = local_1b78.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar29 < p_Var31) goto LAB_00138a96;
                      plVar24 = (long *)std::__cxx11::string::replace
                                                  ((ulong)&local_1b78,0,(char *)0x0,
                                                   (ulong)local_1b58._M_nxt);
                    }
                    else {
LAB_00138a96:
                      plVar24 = (long *)std::__cxx11::string::_M_append
                                                  ((char *)&local_1b58,
                                                   (ulong)local_1b78._M_dataplus._M_p);
                    }
                    p_Var2 = (__node_base *)(plVar24 + 2);
                    if ((__node_base *)*plVar24 == p_Var2) {
                      local_1c08._M_nxt = p_Var2->_M_nxt;
                      _Stack_1c00._M_nxt = (_Hash_node_base *)plVar24[3];
                      local_1c18 = &local_1c08;
                    }
                    else {
                      local_1c08._M_nxt = p_Var2->_M_nxt;
                      local_1c18 = (__node_base *)*plVar24;
                    }
                    local_1c10 = (__buckets_ptr)plVar24[1];
                    *plVar24 = (long)p_Var2;
                    plVar24[1] = 0;
                    *(undefined1 *)&p_Var2->_M_nxt = 0;
                    plVar24 = (long *)std::__cxx11::string::append((char *)&local_1c18);
                    p_Var3 = (__node_base *)(plVar24 + 2);
                    if ((__node_base *)*plVar24 == p_Var3) {
                      local_1bc8._M_nxt = p_Var3->_M_nxt;
                      sStack_1bc0 = plVar24[3];
                      local_1bd8 = &local_1bc8;
                    }
                    else {
                      local_1bc8._M_nxt = p_Var3->_M_nxt;
                      local_1bd8 = (__node_base *)*plVar24;
                    }
                    local_1bd0 = plVar24[1];
                    *plVar24 = (long)p_Var3;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    plVar24 = (long *)std::__cxx11::string::append((char *)&local_1bd8);
                    p_Var4 = (__node_base *)(plVar24 + 2);
                    if ((__node_base *)*plVar24 == p_Var4) {
                      local_1b20._M_nxt = p_Var4->_M_nxt;
                      sStack_1b18 = plVar24[3];
                      local_1b30 = &local_1b20;
                    }
                    else {
                      local_1b20._M_nxt = p_Var4->_M_nxt;
                      local_1b30 = (__node_base *)*plVar24;
                    }
                    local_1b28 = plVar24[1];
                    *plVar24 = (long)p_Var4;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    plVar24 = (long *)std::__cxx11::string::append((char *)&local_1b30);
                    puVar5 = (ulong *)(plVar24 + 2);
                    if ((ulong *)*plVar24 == puVar5) {
                      local_1be8 = *puVar5;
                      p_Stack_1be0 = (__node_base_ptr)plVar24[3];
                      local_1bf8 = &local_1be8;
                    }
                    else {
                      local_1be8 = *puVar5;
                      local_1bf8 = (ulong *)*plVar24;
                    }
                    local_1bf0 = plVar24[1];
                    *plVar24 = (long)puVar5;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    uint64_string_abi_cxx11_
                              (&local_1b98,*(uint64_t *)(local_16e8._256_8_ + local_1c78 * 8));
                    uVar33 = 0xf;
                    if (local_1bf8 != &local_1be8) {
                      uVar33 = local_1be8;
                    }
                    uVar35 = (long)(_Hash_node_base **)local_1b98._M_string_length + local_1bf0;
                    if (uVar33 < uVar35) {
                      uVar29 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
                        uVar29 = local_1b98.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar29 < uVar35) goto LAB_00138cb0;
                      puVar22 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_1b98,0,(char *)0x0,(ulong)local_1bf8);
                    }
                    else {
LAB_00138cb0:
                      puVar22 = (undefined8 *)
                                std::__cxx11::string::_M_append
                                          ((char *)&local_1bf8,(ulong)local_1b98._M_dataplus._M_p);
                    }
                    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(puVar22 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar22 == paVar6) {
                      local_1c30._M_allocated_capacity = paVar6->_M_allocated_capacity;
                      local_1c30._8_8_ = puVar22[3];
                      local_1c50._16_8_ = &local_1c30;
                    }
                    else {
                      local_1c30._M_allocated_capacity = paVar6->_M_allocated_capacity;
                      local_1c50._16_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*puVar22;
                    }
                    local_1c38._M_nxt = (_Hash_node_base *)puVar22[1];
                    *puVar22 = paVar6;
                    puVar22[1] = 0;
                    paVar6->_M_local_buf[0] = '\0';
                    plVar24 = (long *)std::__cxx11::string::append(local_1c50 + 0x10);
                    pVVar34 = local_1c20;
                    pIVar7 = (Impl *)(plVar24 + 2);
                    if ((Impl *)*plVar24 == pIVar7) {
                      local_1c50._0_8_ = (pIVar7->allocator).impl;
                      local_1c50._8_8_ = plVar24[3];
                      local_1c60.impl = (Impl *)local_1c50;
                    }
                    else {
                      local_1c50._0_8_ = (pIVar7->allocator).impl;
                      local_1c60.impl = (Impl *)*plVar24;
                    }
                    local_1c58 = plVar24[1];
                    *plVar24 = (long)pIVar7;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    stage_to_string_abi_cxx11_
                              (&local_1bb8,
                               *(VkShaderStageFlagBits *)
                                ((long)&local_1c20->pStages->stage + local_1c70));
                    pIVar28 = (Impl *)0xf;
                    if (local_1c60.impl != (Impl *)local_1c50) {
                      pIVar28 = (Impl *)local_1c50._0_8_;
                    }
                    if (pIVar28 < (Impl *)(local_1bb8._M_string_length + local_1c58)) {
                      uVar29 = (Impl *)0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
                        uVar29 = local_1bb8.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar29 < (Impl *)(local_1bb8._M_string_length + local_1c58))
                      goto LAB_00138df8;
                      puVar22 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_1bb8,0,(char *)0x0,(ulong)local_1c60.impl);
                    }
                    else {
LAB_00138df8:
                      puVar22 = (undefined8 *)
                                std::__cxx11::string::_M_append
                                          ((char *)&local_1c60,(ulong)local_1bb8._M_dataplus._M_p);
                    }
                    local_1ca0._M_dataplus._M_p = (pointer)&local_1ca0.field_2;
                    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(puVar22 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar22 == paVar6) {
                      local_1ca0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                      local_1ca0.field_2._8_8_ = puVar22[3];
                    }
                    else {
                      local_1ca0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                      local_1ca0._M_dataplus._M_p = (pointer)*puVar22;
                    }
                    local_1ca0._M_string_length = puVar22[1];
                    *puVar22 = paVar6;
                    puVar22[1] = 0;
                    paVar6->_M_local_buf[0] = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
                      operator_delete(local_1bb8._M_dataplus._M_p,
                                      (ulong)(local_1bb8.field_2._M_allocated_capacity + 1));
                    }
                    if (local_1c60.impl != (Impl *)local_1c50) {
                      operator_delete(local_1c60.impl,
                                      (ulong)((long)&(((
                                                  vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                  *)local_1c50._0_8_)->
                                                  super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c50._16_8_ != &local_1c30) {
                      operator_delete((void *)local_1c50._16_8_,
                                      (ulong)(local_1c30._M_allocated_capacity + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
                      operator_delete(local_1b98._M_dataplus._M_p,
                                      local_1b98.field_2._M_allocated_capacity + 1);
                    }
                    if (local_1bf8 != &local_1be8) {
                      operator_delete(local_1bf8,local_1be8 + 1);
                    }
                    if (local_1b30 != &local_1b20) {
                      operator_delete(local_1b30,(ulong)((long)&(local_1b20._M_nxt)->_M_nxt + 1));
                    }
                    if (local_1bd8 != &local_1bc8) {
                      operator_delete(local_1bd8,(ulong)((long)&(local_1bc8._M_nxt)->_M_nxt + 1));
                    }
                    if (local_1c18 != &local_1c08) {
                      operator_delete(local_1c18,(ulong)((long)&(local_1c08._M_nxt)->_M_nxt + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
                      operator_delete(local_1b78._M_dataplus._M_p,
                                      (ulong)(local_1b78.field_2._M_allocated_capacity + 1));
                    }
                    if (local_1b58._M_nxt != local_1b48) {
                      operator_delete(local_1b58._M_nxt,
                                      (ulong)((long)&(local_1b48[0]._M_nxt)->_M_nxt + 1));
                    }
                    if (local_1a78 == 0) {
                      main_cold_12();
LAB_00139065:
                      fflush(_stderr);
                    }
                    else {
                      lVar30 = std::__cxx11::string::find
                                         (local_1ab8._M_local_buf,(ulong)local_1a80,0);
                      if (lVar30 != -1) {
                        main_cold_11();
                        goto LAB_00139065;
                      }
                    }
                    bVar18 = Fossilize::write_string_to_file
                                       (local_1ca0._M_dataplus._M_p,
                                        (char *)local_1ab8._M_allocated_capacity);
                    if (!bVar18) {
                      main_cold_13();
                      local_1c80 = 1;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
                      operator_delete(local_1ca0._M_dataplus._M_p,
                                      local_1ca0.field_2._M_allocated_capacity + 1);
                    }
                    sVar25 = local_1b10;
                    sVar26 = local_1c78;
                    uVar29 = local_1c80;
                    if (!bVar18) {
                      iVar20 = 1;
                      bVar36 = local_1ca1;
                      goto LAB_001390af;
                    }
                    uVar33 = local_1ae0 + 1;
                    uVar35 = local_1c70 + 0x30;
                    bVar36 = uVar33 < pVVar34->stageCount;
                  } while ((bool)bVar36);
                  iVar20 = 0;
                }
LAB_001390af:
                if ((bVar36 & 1) != 0) goto LAB_001390ca;
                sVar26 = sVar26 + 1;
              } while (sVar26 != sVar25);
              iVar20 = 0x37;
            }
LAB_001390ca:
            if (iVar20 == 0x37) {
              main_cold_14();
              iVar20 = 0;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ab8._M_allocated_capacity != &local_1aa8) {
          operator_delete((void *)local_1ab8._M_allocated_capacity,
                          local_1aa8._M_allocated_capacity + 1);
        }
        if (iVar20 == 0) goto LAB_0013809e;
      }
      else {
        local_1ab8._M_allocated_capacity = (size_type)&local_1aa8;
        local_1ab8._8_8_ = 0;
        local_1aa8._M_allocated_capacity = (ulong)(uint7)local_1aa8._M_allocated_capacity._1_7_ << 8
        ;
        bVar36 = local_16e8._96_8_ - local_16e8._88_8_ != 0;
        if ((bool)bVar36) {
          uVar33 = (long)(local_16e8._96_8_ - local_16e8._88_8_) >> 3;
          paVar6 = &local_1ca0.field_2;
          local_1c78 = -(ulong)(uVar33 == 0) - uVar33;
          uVar35 = 1;
          do {
            local_1c70 = CONCAT71(local_1c70._1_7_,bVar36);
            disassemble_spirv_abi_cxx11_
                      (&local_1ca0,(VulkanDevice *)&local_1348,(VkPipeline)0x0,local_1c64,
                       VK_SHADER_STAGE_ALL,*(pointer)(local_16e8._88_8_ + (uVar35 - 1) * 8),
                       (char *)0x0);
            std::__cxx11::string::operator=((string *)local_1ab8._M_local_buf,(string *)&local_1ca0)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1ca0._M_dataplus._M_p != paVar6) {
              operator_delete(local_1ca0._M_dataplus._M_p,
                              local_1ca0.field_2._M_allocated_capacity + 1);
            }
            uVar13 = *(uint64_t *)(local_16e8._280_8_ + (uVar35 - 1) * 8);
            local_1c60.impl = (Impl *)local_1c50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c60,local_1b00,(long)local_1af8 + (long)local_1b00);
            std::__cxx11::string::append((char *)&local_1c60);
            uint64_string_abi_cxx11_((string *)(local_1c50 + 0x10),uVar13);
            pIVar28 = (Impl *)0xf;
            if (local_1c60.impl != (Impl *)local_1c50) {
              pIVar28 = (Impl *)local_1c50._0_8_;
            }
            pIVar8 = (Impl *)((long)&(local_1c38._M_nxt)->_M_nxt + local_1c58);
            if (pIVar28 < pIVar8) {
              uVar29 = (Impl *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c50._16_8_ != &local_1c30) {
                uVar29 = local_1c30._M_allocated_capacity;
              }
              if ((ulong)uVar29 < pIVar8) goto LAB_00137699;
              puVar22 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)(local_1c50 + 0x10),0,(char *)0x0,(ulong)local_1c60.impl);
            }
            else {
LAB_00137699:
              puVar22 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_1c60,local_1c50._16_8_);
            }
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar22 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar22 == paVar1) {
              local_1ca0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_1ca0.field_2._8_8_ = puVar22[3];
              local_1ca0._M_dataplus._M_p = (pointer)paVar6;
            }
            else {
              local_1ca0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_1ca0._M_dataplus._M_p = (pointer)*puVar22;
            }
            local_1ca0._M_string_length = puVar22[1];
            *puVar22 = paVar1;
            puVar22[1] = 0;
            paVar1->_M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c50._16_8_ != &local_1c30) {
              operator_delete((void *)local_1c50._16_8_,
                              (ulong)(local_1c30._M_allocated_capacity + 1));
            }
            if (local_1c60.impl != (Impl *)local_1c50) {
              operator_delete(local_1c60.impl,
                              (ulong)((long)&(((vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                *)local_1c50._0_8_)->
                                             super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if (local_1a78 == 0) {
              main_cold_16();
LAB_001377ee:
              fflush(_stderr);
            }
            else {
              lVar30 = std::__cxx11::string::find(local_1ab8._M_local_buf,(ulong)local_1a80,0);
              if (lVar30 != -1) {
                main_cold_15();
                goto LAB_001377ee;
              }
            }
            bVar18 = Fossilize::write_string_to_file
                               (local_1ca0._M_dataplus._M_p,(char *)local_1ab8._M_allocated_capacity
                               );
            if (!bVar18) {
              main_cold_17();
              local_1c80 = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1ca0._M_dataplus._M_p != paVar6) {
              operator_delete(local_1ca0._M_dataplus._M_p,
                              local_1ca0.field_2._M_allocated_capacity + 1);
            }
            if (!bVar18) {
              bVar36 = (byte)local_1c70;
              break;
            }
            bVar36 = uVar35 < uVar33;
            lVar30 = local_1c78 + uVar35;
            uVar35 = uVar35 + 1;
          } while (lVar30 != 0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ab8._M_allocated_capacity != &local_1aa8) {
          operator_delete((void *)local_1ab8._M_allocated_capacity,
                          local_1aa8._M_allocated_capacity + 1);
        }
        uVar29 = local_1c80;
        if ((bVar36 & 1) == 0) {
LAB_0013809e:
          uVar29 = 0;
        }
      }
      std::
      _Hashtable<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_19a8);
      DisasmReplayer::~DisasmReplayer((DisasmReplayer *)local_16e8);
      Fossilize::StateReplayer::~StateReplayer(&local_1a60);
    }
    iVar20 = (int)uVar29;
    Fossilize::VulkanDevice::~VulkanDevice((VulkanDevice *)&local_1348);
    pDVar21 = local_1b38;
    if (local_1ad8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1ad8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1ad8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1ad8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_1970._vptr_StateCreatorInterface = (_func_int **)&PTR__FilterReplayer_004c1430;
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_1888);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_18c0);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_18f8);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_1930);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_1968);
  }
  (*pDVar21->_vptr_DatabaseInterface[1])(pDVar21);
LAB_00136e4d:
  if (local_13d8.cbs.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar9 = &local_13d8.cbs.default_handler;
    (*local_13d8.cbs.default_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar9,(_Any_data *)pfVar9,__destroy_functor);
  }
  if (local_13d8.cbs.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar10 = &local_13d8.cbs.error_handler;
    (*local_13d8.cbs.error_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar10,(_Any_data *)pfVar10,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_13d8);
  if (local_19b8 != (_Manager_type)0x0) {
    (*local_19b8)(&local_19c8,&local_19c8,__destroy_functor);
  }
  if (local_19d8 != (VkPhysicalDevice)0x0) {
    (*(code *)local_19d8)(&local_19e8,&local_19e8,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1a40 + 0x20));
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1840);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(auStack_1810 + 8));
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_17d0);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1798);
  if (local_1a80 != &local_1a70) {
    operator_delete(local_1a80,CONCAT71(uStack_1a6f,local_1a70) + 1);
  }
  if (local_1b00 != local_1af0) {
    operator_delete(local_1b00,CONCAT71(local_1af0[0]._M_nxt._1_7_,local_1af0[0]._M_nxt._0_1_) + 1);
  }
  if ((undefined1 *)local_1a40._0_8_ != local_1a40 + 0x10) {
    operator_delete((void *)local_1a40._0_8_,CONCAT71(local_1a40._17_7_,local_1a40[0x10]) + 1);
  }
  return iVar20;
}

Assistant:

int main(int argc, char *argv[])
{
	string json_path;
	string output;
	string disasm_match;
	VulkanDevice::Options opts;
	DisasmMethod method = DisasmMethod::Asm;
	bool module_only = false;

	std::unordered_set<Hash> filter_graphics;
	std::unordered_set<Hash> filter_compute;
	std::unordered_set<Hash> filter_raytracing;
	std::unordered_set<Hash> filter_modules;

	CLICallbacks cbs;
	cbs.default_handler = [&](const char *arg) { json_path = arg; };
	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--device-index", [&](CLIParser &parser) { opts.device_index = parser.next_uint(); });
	cbs.add("--enable-validation", [&](CLIParser &) { opts.enable_validation = true; });
	cbs.add("--output", [&](CLIParser &parser) { output = parser.next_string(); });
	cbs.add("--target", [&](CLIParser &parser) {
		method = method_from_string(parser.next_string());
	});
	cbs.add("--module-only", [&](CLIParser &) { module_only = true; });
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--disasm-match", [&](CLIParser &parser) {
		disasm_match = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (json_path.empty())
	{
		LOGE("No path to serialized state provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto resolver = unique_ptr<DatabaseInterface>(create_database(json_path.c_str(), DatabaseMode::ReadOnly));
	if (!resolver->prepare())
	{
		LOGE("Failed to open database: %s\n", json_path.c_str());
		return EXIT_FAILURE;
	}

	FilterReplayer filter_replayer;
	vector<uint8_t> state_json;

	VulkanDevice device;
	if (method == DisasmMethod::ISA)
	{
		StateReplayer application_info_replayer;
		replay_all_hashes(RESOURCE_APPLICATION_INFO, *resolver, application_info_replayer, filter_replayer, state_json, nullptr);

		opts.want_amd_shader_info = true;
		opts.want_pipeline_stats = true;
		opts.application_info = filter_replayer.app;
		opts.features = filter_replayer.pdf2;

		if (module_only)
		{
			LOGE("Cannot do module-only disassembly with ISA target.\n");
			return EXIT_FAILURE;
		}

		if (!device.init_device(opts))
		{
			LOGE("Failed to create device.\n");
			return EXIT_FAILURE;
		}

		if (!device.has_amd_shader_info() && !device.has_pipeline_stats())
		{
			LOGE("Neither AMD_shader_info or executable properties extension are available.\n");
			return EXIT_FAILURE;
		}
	}

	bool use_filter = !filter_graphics.empty() || !filter_compute.empty() ||
	                  !filter_raytracing.empty() || !filter_modules.empty();

	if (use_filter && !module_only)
	{
		StateReplayer state_replayer;

		state_replayer.set_resolve_derivative_pipeline_handles(false);
		state_replayer.set_resolve_shader_module_handles(false);

		filter_replayer.filter_graphics = std::move(filter_graphics);
		filter_replayer.filter_compute = std::move(filter_compute);
		filter_replayer.filter_raytracing = std::move(filter_raytracing);
		filter_replayer.filter_modules = std::move(filter_modules);

		// Don't know which pipelines depend on a module in question, so need to replay all pipelines and promote on demand.
		bool replay_all = !filter_replayer.filter_modules.empty();

		static const ResourceTag early_playback_order[] = {
			RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in samplers.
			RESOURCE_PIPELINE_LAYOUT,
			RESOURCE_RENDER_PASS,
		};

		for (auto tag : early_playback_order)
			replay_all_hashes(tag, *resolver, state_replayer, filter_replayer, state_json, nullptr);

		if (replay_all)
		{
			static const ResourceTag playback_order[] = {
				RESOURCE_GRAPHICS_PIPELINE,
				RESOURCE_COMPUTE_PIPELINE,
				RESOURCE_RAYTRACING_PIPELINE,
			};

			for (auto tag : playback_order)
				replay_all_hashes(tag, *resolver, state_replayer, filter_replayer, state_json, nullptr);
		}
		else
		{
			// Need copies since we might modify the hashmap inside the replay callback.
			auto replays_graphics = filter_replayer.filter_graphics;
			auto replays_compute = filter_replayer.filter_compute;
			auto replays_raytracing = filter_replayer.filter_raytracing;
			replay_all_hashes(RESOURCE_GRAPHICS_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_graphics);
			replay_all_hashes(RESOURCE_COMPUTE_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_compute);
			replay_all_hashes(RESOURCE_RAYTRACING_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_raytracing);
		}

		filter_graphics = std::move(filter_replayer.filter_graphics);
		filter_compute = std::move(filter_replayer.filter_compute);
		filter_raytracing = std::move(filter_replayer.filter_raytracing);
		filter_modules = std::move(filter_replayer.filter_modules);
		for (auto hash : filter_replayer.filter_modules_promoted)
			filter_modules.insert(hash);
	}

	StateReplayer state_replayer;
	DisasmReplayer replayer(device.get_device() ? &device : nullptr);
	replayer.filter_graphics = std::move(filter_graphics);
	replayer.filter_compute = std::move(filter_compute);
	replayer.filter_raytracing = std::move(filter_raytracing);
	replayer.filter_modules = std::move(filter_modules);

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_SHADER_MODULE, // Kick off shader modules first since it can be done in a thread while we deal with trivial objects.
		RESOURCE_SAMPLER, // Trivial, run in main thread.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
		RESOURCE_GRAPHICS_PIPELINE, // Multi-threaded
		RESOURCE_COMPUTE_PIPELINE, // Multi-threaded
		RESOURCE_RAYTRACING_PIPELINE, // Multi-threaded
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : playback_order)
	{
		if (module_only && tag != RESOURCE_SHADER_MODULE)
			continue;

		LOGI("Replaying tag: %s\n", tag_names[tag]);
		const unordered_set<Hash> *filter = nullptr;

		if (use_filter)
		{
			switch (tag)
			{
			case RESOURCE_SHADER_MODULE: filter = &replayer.filter_modules; break;
			case RESOURCE_GRAPHICS_PIPELINE: filter = &replayer.filter_graphics; break;
			case RESOURCE_COMPUTE_PIPELINE: filter = &replayer.filter_compute; break;
			case RESOURCE_RAYTRACING_PIPELINE: filter = &replayer.filter_raytracing; break;
			default: break;
			}
		}

		replay_all_hashes(tag, *resolver, state_replayer, replayer, state_json, filter);
		LOGI("Replayed tag: %s\n", tag_names[tag]);
	}

	unordered_set<VkShaderModule> unique_shader_modules;

	if (module_only)
	{
		string disassembled;
		size_t module_count = replayer.shader_module_infos.size();
		for (size_t i = 0; i < module_count; i++)
		{
			auto *module_info = replayer.shader_module_infos[i];
			disassembled = disassemble_spirv(device, VK_NULL_HANDLE, method, VK_SHADER_STAGE_ALL,
			                                 module_info, nullptr);

			auto module_hash = replayer.module_hashes[i];
			string path = output + "/" + uint64_string(module_hash);

			if (disasm_match.empty())
				LOGI("Dumping disassembly to: %s\n", path.c_str());
			else if (disassembled.find(disasm_match) != std::string::npos)
				LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

			if (!write_string_to_file(path.c_str(), disassembled.c_str()))
			{
				LOGE("Failed to write disassembly to file: %s\n", output.c_str());
				return EXIT_FAILURE;
			}
		}
	}
	else
	{
		string disassembled;
		size_t graphics_pipeline_count = replayer.graphics_infos.size();
		for (size_t i = 0; i < graphics_pipeline_count; i++)
		{
			auto *info = replayer.graphics_infos[i];
			for (uint32_t j = 0; j < info->stageCount; j++)
			{
				VkShaderModule module = info->pStages[j].module;
				unique_shader_modules.insert(module);
				unsigned index = replayer.module_to_index[module];
				auto *module_info = replayer.shader_module_infos[index];
				disassembled = disassemble_spirv(device, replayer.graphics_pipelines[i], method, info->pStages[j].stage,
				                                 module_info, info->pStages[j].pName);

				Hash module_hash = replayer.module_hashes[index];

				string path = output + "/" + uint64_string(module_hash) + "." +
				              info->pStages[j].pName + "." +
				              uint64_string(replayer.graphics_hashes[i]) +
				              "." + stage_to_string(info->pStages[j].stage);

				if (disasm_match.empty())
					LOGI("Dumping disassembly to: %s\n", path.c_str());
				else if (disassembled.find(disasm_match) != std::string::npos)
					LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

				if (!write_string_to_file(path.c_str(), disassembled.c_str()))
				{
					LOGE("Failed to write disassembly to file: %s\n", output.c_str());
					return EXIT_FAILURE;
				}
			}
		}

		size_t compute_pipeline_count = replayer.compute_infos.size();
		for (size_t i = 0; i < compute_pipeline_count; i++)
		{
			auto *info = replayer.compute_infos[i];
			VkShaderModule module = info->stage.module;
			unique_shader_modules.insert(module);

			unsigned index = replayer.module_to_index[module];
			auto *module_info = replayer.shader_module_infos[index];
			disassembled = disassemble_spirv(device, replayer.compute_pipelines[i], method, info->stage.stage,
			                                 module_info, info->stage.pName);

			Hash module_hash = replayer.module_hashes[index];

			string path = output + "/" + uint64_string(module_hash) + "." +
			              info->stage.pName + "." +
			              uint64_string(replayer.compute_hashes[i]) +
			              "." + stage_to_string(info->stage.stage);

			if (disasm_match.empty())
				LOGI("Dumping disassembly to: %s\n", path.c_str());
			else if (disassembled.find(disasm_match) != std::string::npos)
				LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

			if (!write_string_to_file(path.c_str(), disassembled.c_str()))
			{
				LOGE("Failed to write disassembly to file: %s\n", output.c_str());
				return EXIT_FAILURE;
			}
		}

		size_t raytracing_pipeline_count = replayer.raytracing_infos.size();
		for (size_t i = 0; i < raytracing_pipeline_count; i++)
		{
			auto *info = replayer.raytracing_infos[i];
			for (uint32_t j = 0; j < info->stageCount; j++)
			{
				VkShaderModule module = info->pStages[j].module;
				unique_shader_modules.insert(module);
				unsigned index = replayer.module_to_index[module];
				auto *module_info = replayer.shader_module_infos[index];
				disassembled = disassemble_spirv(device, replayer.raytracing_pipelines[i], method, info->pStages[j].stage,
												 module_info, info->pStages[j].pName);

				Hash module_hash = replayer.module_hashes[index];

				string path = output + "/" + uint64_string(module_hash) + "." +
						info->pStages[j].pName + "." +
						uint64_string(replayer.raytracing_hashes[i]) +
						"." + stage_to_string(info->pStages[j].stage);

				if (disasm_match.empty())
					LOGI("Dumping disassembly to: %s\n", path.c_str());
				else if (disassembled.find(disasm_match) != std::string::npos)
					LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

				if (!write_string_to_file(path.c_str(), disassembled.c_str()))
				{
					LOGE("Failed to write disassembly to file: %s\n", output.c_str());
					return EXIT_FAILURE;
				}
			}
		}

		LOGI("Shader modules used: %u, shader modules in database: %u\n",
		     unsigned(unique_shader_modules.size()), unsigned(replayer.shader_module_infos.size()));
	}
	return EXIT_SUCCESS;
}